

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::addCombinedMemory(MultiMemoryLowering *this)

{
  char *pcVar1;
  Name name;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_20;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  name.super_IString.str._M_str = (char *)(this->combinedMemory).super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_20;
  Builder::makeMemory(name,(Address)(this->combinedMemory).super_IString.str._M_str,(Address)0x0,
                      false,(Type)0x0);
  *(bool *)((long)local_20._M_t.
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = this->isShared
  ;
  *(uintptr_t *)
   ((long)local_20._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50) = (this->pointerType).id
  ;
  *(address64_t *)
   ((long)local_20._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) =
       (this->totalInitialPages).addr;
  *(address64_t *)
   ((long)local_20._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) =
       (this->totalMaxPages).addr;
  if (this->isImported == true) {
    pcVar1 = (this->base).super_IString.str._M_str;
    *(size_t *)
     ((long)local_20._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x28) =
         (this->base).super_IString.str._M_len;
    *(char **)((long)local_20._M_t.
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x30) = pcVar1;
    pcVar1 = (this->module).super_IString.str._M_str;
    *(size_t *)
     ((long)local_20._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x18) =
         (this->module).super_IString.str._M_len;
    *(char **)((long)local_20._M_t.
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x20) = pcVar1;
  }
  Module::addMemory(this->wasm,&local_20);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void addCombinedMemory() {
    auto memory = Builder::makeMemory(combinedMemory);
    memory->shared = isShared;
    memory->indexType = pointerType;
    memory->initial = totalInitialPages;
    memory->max = totalMaxPages;
    if (isImported) {
      memory->base = base;
      memory->module = module;
    }
    wasm->addMemory(std::move(memory));
  }